

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGeneric<short,short,short,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseANDOperator,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  short *ldata_00;
  short *rdata_00;
  short *result_data_00;
  SelectionVector *lsel;
  UnifiedVectorFormat *in_RCX;
  VectorType in_DL;
  ulong in_RSI;
  ulong in_RDI;
  byte in_R8B;
  short *result_data;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  SelectionVector *rsel;
  undefined1 *count_00;
  ValidityMask *in_stack_ffffffffffffff30;
  ValidityMask *in_stack_ffffffffffffff38;
  ValidityMask *in_stack_ffffffffffffff40;
  SelectionVector local_b8 [2];
  UnifiedVectorFormat local_80 [16];
  undefined1 local_70 [63];
  byte local_31;
  undefined8 local_30;
  VectorType local_28;
  ulong local_20;
  ulong local_18;
  
  local_31 = in_R8B & 1;
  local_30 = in_RCX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_28 = in_DL;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_80);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&stack0xffffffffffffff38);
  duckdb::Vector::ToUnifiedFormat(local_18,local_30);
  duckdb::Vector::ToUnifiedFormat(local_20,local_30);
  duckdb::Vector::SetVectorType(local_28);
  ldata_00 = FlatVector::GetData<short>((Vector *)0xe3dd1d);
  rdata_00 = UnifiedVectorFormat::GetData<short>(local_80);
  result_data_00 =
       UnifiedVectorFormat::GetData<short>((UnifiedVectorFormat *)&stack0xffffffffffffff38);
  count_00 = local_70;
  rsel = local_b8;
  lsel = (SelectionVector *)FlatVector::Validity((Vector *)0xe3dda2);
  ExecuteGenericLoop<short,short,short,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseANDOperator,bool>
            (ldata_00,rdata_00,result_data_00,lsel,rsel,(idx_t)count_00,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,(bool)local_30._7_1_);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)rsel);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)rsel);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}